

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_motion.c
# Opt level: O0

int64_t av1_refine_integerized_param
                  (WarpedMotionParams *wm,TransformationType wmtype,int use_hbd,int bd,uint8_t *ref,
                  int r_width,int r_height,int r_stride,uint8_t *dst,int d_width,int d_height,
                  int d_stride,int n_refinements,int64_t ref_frame_error,uint8_t *segment_map,
                  int segment_map_stride,double gm_erroradv_tr)

{
  int iVar1;
  TransformationType TVar2;
  long lVar3;
  uint8_t *ref_00;
  int32_t *piVar4;
  int64_t iVar5;
  int in_EDX;
  undefined8 unaff_RBX;
  undefined8 unaff_RBP;
  byte in_SIL;
  WarpedMotionParams *in_RDI;
  uint8_t *in_R8;
  undefined8 unaff_R12;
  undefined8 unaff_R13;
  int64_t unaff_R14;
  uint8_t *unaff_R15;
  double in_XMM0_Qa;
  int in_stack_00000038;
  long in_stack_00000040;
  int step_dir;
  int64_t selection_threshold;
  int64_t selection_threshold_1;
  int32_t best_param;
  int32_t curr_param;
  int32_t *param;
  int32_t step;
  int64_t best_error;
  int64_t step_error;
  int32_t *param_mat;
  int n_params;
  int p;
  int i;
  int border;
  int32_t in_stack_fffffffffffffeec;
  int32_t iVar6;
  int in_stack_fffffffffffffef4;
  undefined4 uVar7;
  undefined4 in_stack_ffffffffffffff1c;
  int in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff44;
  int iVar8;
  uint8_t *in_stack_ffffffffffffff48;
  undefined8 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff58;
  int32_t iVar9;
  undefined4 in_stack_ffffffffffffff5c;
  int32_t iVar10;
  int64_t local_90;
  int local_74;
  int local_70;
  int in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffb0;
  WarpedMotionParams *gm;
  undefined8 in_stack_ffffffffffffffc8;
  int p_height;
  int subsampling_x;
  int subsampling_y;
  int segment_map_stride_00;
  
  iVar1 = av1_refine_integerized_param::max_trans_model_params[in_SIL];
  gm = in_RDI;
  force_wmtype(in_RDI,in_SIL);
  TVar2 = get_wmtype(gm);
  segment_map_stride_00 = (int)unaff_RBP;
  subsampling_y = (int)unaff_R13;
  subsampling_x = (int)unaff_R12;
  p_height = (int)unaff_RBX;
  iVar8 = (int)in_stack_ffffffffffffffc8;
  gm->wmtype = TVar2;
  if (in_stack_00000038 == 0) {
    lVar3 = lrint((double)in_stack_00000040 * in_XMM0_Qa);
    local_90 = get_warp_error((WarpedMotionParams *)
                              CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                              (int)((ulong)lVar3 >> 0x20),(int)lVar3,in_stack_ffffffffffffff48,
                              in_stack_ffffffffffffff44,in_stack_ffffffffffffff40,
                              in_stack_ffffffffffffffa0,in_R8,in_stack_ffffffffffffffb0,in_EDX,
                              (int)gm,iVar8,p_height,subsampling_x,subsampling_y,unaff_R14,unaff_R15
                              ,segment_map_stride_00);
  }
  else {
    ref_00 = (uint8_t *)lrint((double)in_stack_00000040 * 0.7);
    iVar6 = 0;
    uVar7 = 0;
    local_90 = get_warp_error((WarpedMotionParams *)
                              CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58),
                              (int)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                              (int)in_stack_ffffffffffffff50,ref_00,in_stack_ffffffffffffff44,
                              in_stack_ffffffffffffff40,in_stack_ffffffffffffffa0,in_R8,
                              in_stack_ffffffffffffffb0,in_EDX,(int)gm,
                              (int)in_stack_ffffffffffffffc8,(int)unaff_RBX,(int)unaff_R12,
                              (int)unaff_R13,unaff_R14,unaff_R15,(int)unaff_RBP);
    if ((long)ref_00 < local_90) {
      local_90 = 0x7fffffffffffffff;
    }
    else {
      for (local_70 = 0; local_70 < in_stack_00000038; local_70 = local_70 + 1) {
        for (local_74 = 0; local_74 < iVar1; local_74 = local_74 + 1) {
          iVar8 = 0;
          piVar4 = in_RDI->wmmat + local_74;
          iVar9 = *piVar4;
          iVar10 = iVar9;
          iVar6 = add_param_offset(in_stack_fffffffffffffef4,iVar6,in_stack_fffffffffffffeec);
          *piVar4 = iVar6;
          force_wmtype(gm,in_SIL);
          iVar6 = 0;
          iVar5 = get_warp_error((WarpedMotionParams *)CONCAT44(iVar10,iVar9),
                                 (int)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                                 (int)in_stack_ffffffffffffff50,ref_00,iVar8,
                                 in_stack_ffffffffffffff40,in_stack_ffffffffffffffa0,in_R8,
                                 in_stack_ffffffffffffffb0,in_EDX,(int)gm,
                                 (int)in_stack_ffffffffffffffc8,(int)unaff_RBX,(int)unaff_R12,
                                 (int)unaff_R13,unaff_R14,unaff_R15,(int)unaff_RBP);
          if (iVar5 < local_90) {
            iVar9 = *piVar4;
            iVar8 = -1;
            local_90 = iVar5;
          }
          iVar6 = add_param_offset(in_stack_fffffffffffffef4,iVar6,in_stack_fffffffffffffeec);
          *piVar4 = iVar6;
          force_wmtype(gm,in_SIL);
          iVar6 = 0;
          uVar7 = 0;
          iVar5 = get_warp_error((WarpedMotionParams *)CONCAT44(iVar10,iVar9),
                                 (int)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                                 (int)in_stack_ffffffffffffff50,ref_00,iVar8,
                                 in_stack_ffffffffffffff40,in_stack_ffffffffffffffa0,in_R8,
                                 in_stack_ffffffffffffffb0,in_EDX,(int)gm,
                                 (int)in_stack_ffffffffffffffc8,(int)unaff_RBX,(int)unaff_R12,
                                 (int)unaff_R13,unaff_R14,unaff_R15,(int)unaff_RBP);
          if (iVar5 < local_90) {
            iVar9 = *piVar4;
            iVar8 = 1;
            local_90 = iVar5;
          }
          while (iVar8 != 0) {
            iVar6 = add_param_offset(in_stack_fffffffffffffef4,iVar6,in_stack_fffffffffffffeec);
            *piVar4 = iVar6;
            force_wmtype(gm,in_SIL);
            iVar6 = 0;
            uVar7 = 0;
            iVar5 = get_warp_error((WarpedMotionParams *)CONCAT44(iVar10,iVar9),
                                   (int)((ulong)in_stack_ffffffffffffff50 >> 0x20),
                                   (int)in_stack_ffffffffffffff50,ref_00,iVar8,
                                   in_stack_ffffffffffffff40,in_stack_ffffffffffffffa0,in_R8,
                                   in_stack_ffffffffffffffb0,in_EDX,(int)gm,
                                   (int)in_stack_ffffffffffffffc8,(int)unaff_RBX,(int)unaff_R12,
                                   (int)unaff_R13,unaff_R14,unaff_R15,(int)unaff_RBP);
            if (iVar5 < local_90) {
              iVar9 = *piVar4;
              local_90 = iVar5;
            }
            else {
              iVar8 = 0;
            }
          }
          *piVar4 = iVar9;
          force_wmtype(gm,in_SIL);
        }
      }
      TVar2 = get_wmtype(gm);
      gm->wmtype = TVar2;
      av1_get_shear_params((WarpedMotionParams *)CONCAT44(in_stack_ffffffffffffff1c,uVar7));
    }
  }
  return local_90;
}

Assistant:

int64_t av1_refine_integerized_param(
    WarpedMotionParams *wm, TransformationType wmtype, int use_hbd, int bd,
    uint8_t *ref, int r_width, int r_height, int r_stride, uint8_t *dst,
    int d_width, int d_height, int d_stride, int n_refinements,
    int64_t ref_frame_error, uint8_t *segment_map, int segment_map_stride,
    double gm_erroradv_tr) {
  static const int max_trans_model_params[TRANS_TYPES] = { 0, 2, 4, 6 };
  const int border = ERRORADV_BORDER;
  int i = 0, p;
  int n_params = max_trans_model_params[wmtype];
  int32_t *param_mat = wm->wmmat;
  int64_t step_error, best_error;
  int32_t step;
  int32_t *param;
  int32_t curr_param;
  int32_t best_param;

  force_wmtype(wm, wmtype);
  wm->wmtype = get_wmtype(wm);

  if (n_refinements == 0) {
    // Compute the maximum error value that will be accepted, so that
    // get_warp_error can terminate early if it proves the model will not
    // be accepted.
    int64_t selection_threshold =
        (int64_t)lrint(ref_frame_error * gm_erroradv_tr);
    return get_warp_error(wm, use_hbd, bd, ref, r_width, r_height, r_stride,
                          dst + border * d_stride + border, d_stride, border,
                          border, d_width - 2 * border, d_height - 2 * border,
                          0, 0, selection_threshold, segment_map,
                          segment_map_stride);
  }

  // When refining, use a slightly higher threshold for the initial error
  // calculation - see comment above erroradv_early_tr for why.
  int64_t selection_threshold =
      (int64_t)lrint(ref_frame_error * erroradv_early_tr);
  best_error =
      get_warp_error(wm, use_hbd, bd, ref, r_width, r_height, r_stride,
                     dst + border * d_stride + border, d_stride, border, border,
                     d_width - 2 * border, d_height - 2 * border, 0, 0,
                     selection_threshold, segment_map, segment_map_stride);

  if (best_error > selection_threshold) {
    return INT64_MAX;
  }

  step = 1 << (n_refinements - 1);
  for (i = 0; i < n_refinements; i++, step >>= 1) {
    for (p = 0; p < n_params; ++p) {
      int step_dir = 0;
      param = param_mat + p;
      curr_param = *param;
      best_param = curr_param;
      // look to the left
      // Note: We have to use force_wmtype() to keep the proper symmetry for
      // ROTZOOM type models
      *param = add_param_offset(p, curr_param, -step);
      force_wmtype(wm, wmtype);
      step_error =
          get_warp_error(wm, use_hbd, bd, ref, r_width, r_height, r_stride,
                         dst + border * d_stride + border, d_stride, border,
                         border, d_width - 2 * border, d_height - 2 * border, 0,
                         0, best_error, segment_map, segment_map_stride);
      if (step_error < best_error) {
        best_error = step_error;
        best_param = *param;
        step_dir = -1;
      }

      // look to the right
      *param = add_param_offset(p, curr_param, step);
      force_wmtype(wm, wmtype);
      step_error =
          get_warp_error(wm, use_hbd, bd, ref, r_width, r_height, r_stride,
                         dst + border * d_stride + border, d_stride, border,
                         border, d_width - 2 * border, d_height - 2 * border, 0,
                         0, best_error, segment_map, segment_map_stride);
      if (step_error < best_error) {
        best_error = step_error;
        best_param = *param;
        step_dir = 1;
      }

      // look to the direction chosen above repeatedly until error increases
      // for the biggest step size
      while (step_dir) {
        *param = add_param_offset(p, best_param, step * step_dir);
        force_wmtype(wm, wmtype);
        step_error =
            get_warp_error(wm, use_hbd, bd, ref, r_width, r_height, r_stride,
                           dst + border * d_stride + border, d_stride, border,
                           border, d_width - 2 * border, d_height - 2 * border,
                           0, 0, best_error, segment_map, segment_map_stride);
        if (step_error < best_error) {
          best_error = step_error;
          best_param = *param;
        } else {
          step_dir = 0;
        }
      }

      // Restore best parameter value so far
      *param = best_param;
      force_wmtype(wm, wmtype);
    }
  }

  wm->wmtype = get_wmtype(wm);
  // Recompute shear params for the refined model
  // This should never fail, because we only ever consider warp-able models
  if (!av1_get_shear_params(wm)) {
    assert(0);
  }
  return best_error;
}